

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O2

uint get_num_images(char *imgdirpath)

{
  DIR *__dirp;
  dirent *pdVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  
  __dirp = opendir(imgdirpath);
  if (__dirp == (DIR *)0x0) {
    uVar4 = 0;
    fprintf(_stderr,"Could not open Folder %s\n",imgdirpath);
  }
  else {
    uVar4 = 0;
LAB_001037b8:
    do {
      do {
        pdVar1 = readdir(__dirp);
        if (pdVar1 == (dirent *)0x0) goto LAB_0010380e;
        if ((byte)pdVar1->d_name[0] == 0x2e) {
          if (pdVar1->d_name[1] == '\0') goto LAB_001037b8;
          uVar2 = (byte)pdVar1->d_name[1] - 0x2e;
          if (uVar2 == 0) {
            uVar2 = (uint)(byte)pdVar1->d_name[2];
          }
          iVar3 = -uVar2;
        }
        else {
          iVar3 = 0x2e - (uint)(byte)pdVar1->d_name[0];
        }
      } while (iVar3 == 0);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0);
    uVar4 = 0;
    fprintf(_stderr,"Too many files in folder %s\n",imgdirpath);
LAB_0010380e:
    closedir(__dirp);
  }
  return uVar4;
}

Assistant:

unsigned int get_num_images(char *imgdirpath)
{
    DIR *dir;
    struct dirent* content;
    unsigned int num_images = 0;

    /*Reading the input images from given input directory*/

    dir = opendir(imgdirpath);
    if (!dir) {
        fprintf(stderr, "Could not open Folder %s\n", imgdirpath);
        return 0;
    }

    while ((content = readdir(dir)) != NULL) {
        if (strcmp(".", content->d_name) == 0 || strcmp("..", content->d_name) == 0) {
            continue;
        }
        if (num_images == UINT_MAX) {
            fprintf(stderr, "Too many files in folder %s\n", imgdirpath);
            num_images = 0;
            break;
        }
        num_images++;

    }
    closedir(dir);
    return num_images;
}